

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void copy_buffer_config(YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst)

{
  YV12_BUFFER_CONFIG *dst_local;
  YV12_BUFFER_CONFIG *src_local;
  
  dst->bit_depth = src->bit_depth;
  dst->color_primaries = src->color_primaries;
  dst->transfer_characteristics = src->transfer_characteristics;
  dst->matrix_coefficients = src->matrix_coefficients;
  dst->monochrome = src->monochrome;
  dst->chroma_sample_position = src->chroma_sample_position;
  dst->color_range = src->color_range;
  return;
}

Assistant:

static void copy_buffer_config(const YV12_BUFFER_CONFIG *const src,
                               YV12_BUFFER_CONFIG *const dst) {
  dst->bit_depth = src->bit_depth;
  dst->color_primaries = src->color_primaries;
  dst->transfer_characteristics = src->transfer_characteristics;
  dst->matrix_coefficients = src->matrix_coefficients;
  dst->monochrome = src->monochrome;
  dst->chroma_sample_position = src->chroma_sample_position;
  dst->color_range = src->color_range;
}